

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p2sc_file.c
# Opt level: O1

void p2sc_free_iofile(p2sc_iofile_t *f)

{
  if (f != (p2sc_iofile_t *)0x0) {
    if (f->io != (GIOChannel *)0x0) {
      g_io_channel_unref();
    }
    g_free(f->name);
    f->io = (GIOChannel *)0x0;
    f->name = (char *)0x0;
    f->lineno = 0;
    g_free(f);
    return;
  }
  return;
}

Assistant:

void p2sc_free_iofile(p2sc_iofile_t *f) {
    if (f) {
        if (f->io)
            g_io_channel_unref(f->io);
        g_free(f->name);
        memset(f, 0, sizeof *f);
        g_free(f);
    }
}